

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  uint8_t *puVar1;
  int8_t *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VP8Matrix *pVVar6;
  uint16_t *puVar7;
  int16_t *piVar8;
  ulong uVar10;
  int16_t *piVar11;
  int8_t *piVar12;
  uint8_t *puVar13;
  long lVar14;
  uint uVar15;
  int16_t (*paiVar16) [16];
  long lVar17;
  int16_t tmp [8] [16];
  int16_t local_178 [4];
  VP8Encoder *local_170;
  VP8EncIterator *local_168;
  VP8ModeScore *local_160;
  VP8SegmentInfo *local_158;
  uint8_t *local_150;
  uint8_t *local_148;
  int8_t *local_140;
  int16_t local_138 [16];
  int16_t local_118 [16];
  int16_t local_f8 [16];
  int16_t local_d8 [84];
  int16_t *piVar9;
  
  piVar8 = local_178;
  piVar9 = local_178;
  puVar1 = it->yuv_in;
  local_170 = it->enc;
  puVar13 = it->yuv_p + VP8UVModeOffsets[mode];
  uVar15 = *(byte *)it->mb >> 5 & 3;
  uVar10 = 0xfffffffffffffffe;
  piVar11 = local_138;
  puVar7 = VP8ScanUV;
  local_168 = it;
  local_160 = rd;
  local_148 = yuv_out;
  do {
    (*VP8FTransform2)(puVar1 + (ulong)*puVar7 + 0x10,puVar13 + *puVar7,piVar11);
    uVar10 = uVar10 + 2;
    piVar11 = piVar11 + 0x20;
    puVar7 = puVar7 + 2;
  } while (uVar10 < 6);
  local_158 = local_170->dqm + uVar15;
  local_150 = puVar13;
  if (local_168->top_derr != (DError *)0x0) {
    pVVar6 = &local_170->dqm[uVar15].uv;
    piVar12 = local_160->derr[0] + 2;
    local_140 = local_168->top_derr[local_168->x][0] + 1;
    lVar17 = 0;
    lVar14 = 0;
    local_170 = (VP8Encoder *)pVVar6;
    do {
      piVar2 = local_140;
      piVar11 = (int16_t *)((long)local_138 + lVar14);
      *piVar11 = *piVar11 +
                 (short)((uint)(int)(short)(local_140[lVar17 + -1] * 7 +
                                           local_168->left_derr[0][lVar17] * 8) >> 3);
      iVar3 = QuantizeSingle(piVar11,pVVar6);
      piVar11 = (int16_t *)((long)local_118 + lVar14);
      *piVar11 = *piVar11 + (short)((uint)(piVar2[lVar17] * 7) >> 3) + (short)iVar3;
      iVar4 = QuantizeSingle(piVar11,pVVar6);
      piVar11 = (int16_t *)((long)local_f8 + lVar14);
      *piVar11 = *piVar11 +
                 (short)((uint)(iVar3 * 7) >> 3) + (short)local_168->left_derr[0][lVar17 + 1];
      iVar3 = QuantizeSingle(piVar11,pVVar6);
      piVar11 = (int16_t *)((long)local_d8 + lVar14);
      *piVar11 = *piVar11 + (short)((uint)(iVar4 * 7) >> 3) + (short)iVar3;
      iVar5 = QuantizeSingle(piVar11,pVVar6);
      (*(int8_t (*) [3])(piVar12 + -2))[0] = (int8_t)iVar4;
      piVar12[-1] = (int8_t)iVar3;
      *piVar12 = (int8_t)iVar5;
      lVar14 = lVar14 + 0x80;
      piVar12 = piVar12 + 3;
      lVar17 = lVar17 + 2;
    } while (lVar14 == 0x80);
  }
  paiVar16 = local_160->uv_levels;
  pVVar6 = &local_158->uv;
  uVar15 = 0;
  uVar10 = 0xfffffffffffffffe;
  do {
    piVar8 = piVar8 + 0x20;
    iVar3 = (*VP8EncQuantize2Blocks)(piVar8,*paiVar16,pVVar6);
    puVar13 = local_148;
    puVar1 = local_150;
    uVar10 = uVar10 + 2;
    uVar15 = uVar15 | iVar3 << ((byte)uVar10 & 0x1f);
    paiVar16 = paiVar16 + 2;
  } while (uVar10 < 6);
  uVar10 = 0xfffffffffffffffe;
  puVar7 = VP8ScanUV;
  do {
    piVar9 = piVar9 + 0x20;
    (*VP8ITransform)(puVar1 + *puVar7,piVar9,puVar13 + *puVar7,1);
    uVar10 = uVar10 + 2;
    puVar7 = puVar7 + 2;
  } while (uVar10 < 6);
  return uVar15 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* WEBP_RESTRICT const it,
                         VP8ModeScore* WEBP_RESTRICT const rd,
                         uint8_t* WEBP_RESTRICT const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc;
  const uint8_t* const ref = it->yuv_p + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm[it->mb->segment];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr != NULL) CorrectDCValues(it, &dqm->uv, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz[4 + ch + x] + it->left_nz[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv,
              dqm->lambda_trellis_uv);
          it->top_nz[4 + ch + x] = it->left_nz[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}